

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

void __thiscall
MarkdownHighlighter::highlightAdditionalRules
          (MarkdownHighlighter *this,QVector<HighlightingRule> *rules,QString *text)

{
  byte bVar1;
  HighlightingRule *pHVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  QTextFormat *pQVar10;
  HighlightingRule *pHVar11;
  qreal qVar12;
  pair<int,_int> local_90;
  HighlightingRule *local_88;
  QTextCharFormat *local_80;
  QString *local_78;
  QListSpecialMethodsBase<std::pair<int,int>> *local_70;
  HighlighterState *local_68;
  QRegularExpressionMatchIterator iterator;
  QRegularExpressionMatch match;
  QTextCharFormat currentMaskedFormat;
  
  currentMaskedFormat.super_QTextFormat = (QTextFormat)0x18;
  currentMaskedFormat._1_3_ = 0;
  local_78 = text;
  pQVar10 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                       (&_formats,(HighlighterState *)&currentMaskedFormat)->super_QTextFormat;
  local_70 = (QListSpecialMethodsBase<std::pair<int,int>> *)&this->_linkRanges;
  QList<std::pair<int,_int>_>::clear((QList<std::pair<int,_int>_> *)local_70);
  local_88 = (rules->d).ptr;
  pHVar11 = local_88 + (rules->d).size;
  do {
    if (local_88 == pHVar11) {
      return;
    }
    iVar5 = QSyntaxHighlighter::currentBlockState();
    if (iVar5 == -1) {
      bVar3 = QString::contains(local_78,&local_88->shouldContain,CaseSensitive);
      pHVar2 = local_88;
      if (bVar3) {
        QRegularExpression::globalMatch(&iterator,local_88,local_78,0,0,0);
        bVar1 = pHVar2->capturingGroup;
        local_68 = &pHVar2->state;
        local_80 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                             (&_formats,local_68);
        while( true ) {
          cVar4 = QRegularExpressionMatchIterator::hasNext();
          if (cVar4 == '\0') break;
          QRegularExpressionMatchIterator::next();
          iVar5 = (int)&match;
          if (bVar1 != 0) {
            QTextFormat::QTextFormat(&currentMaskedFormat.super_QTextFormat,pQVar10);
            qVar12 = QTextCharFormat::fontPointSize(local_80);
            if (0.0 < qVar12) {
              qVar12 = QTextCharFormat::fontPointSize(local_80);
              QTextCharFormat::setFontPointSize
                        ((QTextCharFormat *)&currentMaskedFormat.super_QTextFormat,qVar12);
            }
            iVar6 = QSyntaxHighlighter::currentBlockState();
            if (iVar6 < 0xc) {
LAB_0011e435:
              if (*local_68 == Link) {
                iVar6 = QRegularExpressionMatch::capturedStart(iVar5);
                iVar7 = QRegularExpressionMatch::capturedStart(iVar5);
                iVar8 = QRegularExpressionMatch::capturedLength(iVar5);
                local_90.first = iVar6;
                local_90.second = iVar8 + iVar7;
                bVar3 = QListSpecialMethodsBase<std::pair<int,int>>::contains<std::pair<int,int>>
                                  (local_70,&local_90);
                if (!bVar3) {
                  local_90.first = iVar6;
                  local_90.second = iVar8 + iVar7;
                  QList<std::pair<int,int>>::emplaceBack<std::pair<int,int>>
                            ((QList<std::pair<int,int>> *)local_70,&local_90);
                }
              }
              iVar6 = QRegularExpressionMatch::capturedStart(iVar5);
              uVar9 = QRegularExpressionMatch::capturedLength(iVar5);
              QSyntaxHighlighter::setFormat((int)this,iVar6,(QTextCharFormat *)(ulong)uVar9);
            }
            else {
              iVar6 = QSyntaxHighlighter::currentBlockState();
              if (0x11 < iVar6) goto LAB_0011e435;
            }
            QTextFormat::~QTextFormat(&currentMaskedFormat.super_QTextFormat);
          }
          iVar6 = QSyntaxHighlighter::currentBlockState();
          if (iVar6 < 0xc) {
LAB_0011e514:
            iVar6 = QRegularExpressionMatch::capturedStart(iVar5);
            uVar9 = QRegularExpressionMatch::capturedLength(iVar5);
            QSyntaxHighlighter::setFormat((int)this,iVar6,(QTextCharFormat *)(ulong)uVar9);
          }
          else {
            iVar6 = QSyntaxHighlighter::currentBlockState();
            if (0x11 < iVar6) goto LAB_0011e514;
            setHeadingStyles(this,*local_68,&match,(uint)bVar1);
          }
          QRegularExpressionMatch::~QRegularExpressionMatch(&match);
        }
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&iterator);
      }
    }
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void MarkdownHighlighter::highlightAdditionalRules(
    const QVector<HighlightingRule> &rules, const QString &text) {
    const auto &maskedFormat = _formats[HighlighterState::MaskedSyntax];
    _linkRanges.clear();

    for (const HighlightingRule &rule : rules) {
        // continue if another current block state was already set if
        // disableIfCurrentStateIsSet is set
        if (currentBlockState() != NoState) continue;

        const bool contains = text.contains(rule.shouldContain);
        if (!contains) continue;

        auto iterator = rule.pattern.globalMatch(text);
        const uint8_t capturingGroup = rule.capturingGroup;
        const uint8_t maskedGroup = rule.maskedGroup;
        const QTextCharFormat &format = _formats[rule.state];

        // find and format all occurrences
        while (iterator.hasNext()) {
            QRegularExpressionMatch match = iterator.next();

            // if there is a capturingGroup set then first highlight
            // everything as MaskedSyntax and highlight capturingGroup
            // with the real format
            if (capturingGroup > 0) {
                QTextCharFormat currentMaskedFormat = maskedFormat;
                // set the font size from the current rule's font format
                if (format.fontPointSize() > 0) {
                    currentMaskedFormat.setFontPointSize(
                        format.fontPointSize());
                }

                if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                    // setHeadingStyles(format, match, maskedGroup);

                } else {
                    // store masked part of the link as a range
                    if (rule.state == Link) {
                        const int start = match.capturedStart(maskedGroup);
                        const int end = match.capturedStart(maskedGroup) +
                                        match.capturedLength(maskedGroup);
                        if (!_linkRanges.contains({start, end})) {
                            _linkRanges.append({start, end});
                        }
                    }

                    setFormat(match.capturedStart(maskedGroup),
                              match.capturedLength(maskedGroup),
                              currentMaskedFormat);
                }
            }
            if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                setHeadingStyles(rule.state, match, capturingGroup);

            } else {
                setFormat(match.capturedStart(capturingGroup),
                          match.capturedLength(capturingGroup), format);
            }
        }
    }
}